

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

bool __thiscall
cmLinkedTree<cmState::SnapshotDataType>::iterator::operator!=(iterator *this,iterator other)

{
  cmLinkedTree<cmState::SnapshotDataType> *pcVar1;
  bool bVar2;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmState::SnapshotDataType> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x76,
                  "bool cmLinkedTree<cmState::SnapshotDataType>::iterator::operator!=(iterator) const [T = cmState::SnapshotDataType]"
                 );
  }
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 ==
      ((long)(pcVar1->Data).
             super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pcVar1->Data).
             super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x34f72c234f72c235) {
    bVar2 = operator==(this,other);
    return !bVar2;
  }
  __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0x77,
                "bool cmLinkedTree<cmState::SnapshotDataType>::iterator::operator!=(iterator) const [T = cmState::SnapshotDataType]"
               );
}

Assistant:

bool operator!=(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      return !(*this == other);
    }